

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIsoSlow.c
# Opt level: O2

Iso_Man_t * Iso_ManStart(Aig_Man_t *pAig)

{
  ulong uVar1;
  uint uVar2;
  Iso_Man_t *pIVar3;
  Iso_Obj_t *pIVar4;
  int *piVar5;
  Vec_Ptr_t *pVVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  
  pIVar3 = (Iso_Man_t *)calloc(1,0x78);
  pIVar3->pAig = pAig;
  iVar9 = pAig->vObjs->nSize;
  pIVar3->nObjs = iVar9;
  pIVar4 = (Iso_Obj_t *)calloc((long)iVar9,0x18);
  pIVar3->pObjs = pIVar4;
  uVar7 = iVar9 - 1;
  do {
    do {
      uVar8 = uVar7 + 1;
      uVar2 = uVar7 & 1;
      uVar7 = uVar8;
    } while (uVar2 != 0);
    uVar10 = 3;
    do {
      iVar9 = (int)uVar10;
      if (uVar8 < (uint)(iVar9 * iVar9)) {
        pIVar3->nBins = uVar8;
        piVar5 = (int *)calloc((long)(int)uVar8,4);
        pIVar3->pBins = piVar5;
        pVVar6 = Vec_PtrAlloc(1000);
        pIVar3->vSingles = pVVar6;
        pVVar6 = Vec_PtrAlloc(1000);
        pIVar3->vClasses = pVVar6;
        pVVar6 = Vec_PtrAlloc(1000);
        pIVar3->vTemp1 = pVVar6;
        pVVar6 = Vec_PtrAlloc(1000);
        pIVar3->vTemp2 = pVVar6;
        pIVar3->nObjIds = 1;
        return pIVar3;
      }
      uVar1 = (ulong)uVar8 % uVar10;
      uVar10 = (ulong)(iVar9 + 2);
    } while ((int)uVar1 != 0);
  } while( true );
}

Assistant:

Iso_Man_t * Iso_ManStart( Aig_Man_t * pAig )
{
    Iso_Man_t * p;
    p = ABC_CALLOC( Iso_Man_t, 1 );
    p->pAig     = pAig;
    p->nObjs    = Aig_ManObjNumMax( pAig );
    p->pObjs    = ABC_CALLOC( Iso_Obj_t, p->nObjs );
    p->nBins    = Abc_PrimeCudd( p->nObjs );
    p->pBins    = ABC_CALLOC( int, p->nBins );    
    p->vSingles = Vec_PtrAlloc( 1000 );
    p->vClasses = Vec_PtrAlloc( 1000 );
    p->vTemp1   = Vec_PtrAlloc( 1000 );
    p->vTemp2   = Vec_PtrAlloc( 1000 );
    p->nObjIds  = 1;
    return p;
}